

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlibraryinfo.cpp
# Opt level: O1

unique_ptr<QSettings,_std::default_delete<QSettings>_> findConfiguration(void)

{
  QString *pQVar1;
  char16_t *pcVar2;
  Data *pDVar3;
  qsizetype qVar4;
  Data *data;
  char16_t *pcVar5;
  bool bVar6;
  QSettings *pQVar7;
  __uniq_ptr_data<QSettings,_std::default_delete<QSettings>,_true,_true> in_RDI;
  long in_FS_OFFSET;
  QStringBuilder<QString_&,_QString> local_a8;
  QString local_88;
  QArrayData *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QString local_48;
  long local_28;
  
  pQVar1 = (anonymous_namespace)::qtconfManualPath;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((anonymous_namespace)::qtconfManualPath != (QString *)0x0) {
    pQVar7 = (QSettings *)operator_new(0x10);
    QSettings::QSettings(pQVar7,pQVar1,IniFormat,(QObject *)0x0);
    *(QSettings **)
     in_RDI.super___uniq_ptr_impl<QSettings,_std::default_delete<QSettings>_>._M_t.
     super__Tuple_impl<0UL,_QSettings_*,_std::default_delete<QSettings>_>.
     super__Head_base<0UL,_QSettings_*,_false>._M_head_impl = pQVar7;
    goto LAB_0020d5e3;
  }
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = L":/qt/etc/qt.conf";
  local_48.d.size = 0x10;
  QLocale::QLocale((QLocale *)&local_68,C,AnyScript,AnyCountry);
  QResource::QResource((QResource *)&local_a8,&local_48,(QLocale *)&local_68);
  bVar6 = QResource::isValid((QResource *)&local_a8);
  QResource::~QResource((QResource *)&local_a8);
  QLocale::~QLocale((QLocale *)&local_68);
  if (bVar6) {
    pQVar7 = (QSettings *)operator_new(0x10);
    QSettings::QSettings(pQVar7,&local_48,IniFormat,(QObject *)0x0);
    *(QSettings **)
     in_RDI.super___uniq_ptr_impl<QSettings,_std::default_delete<QSettings>_>._M_t.
     super__Tuple_impl<0UL,_QSettings_*,_std::default_delete<QSettings>_>.
     super__Head_base<0UL,_QSettings_*,_false>._M_head_impl = pQVar7;
  }
  else {
    bVar6 = QCoreApplication::instanceExists();
    if (bVar6) {
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      QCoreApplication::applicationDirPath();
      local_a8.b.d.d = (Data *)0x0;
      local_a8.b.d.ptr = L"/qt6.conf";
      local_a8.b.d.size = 9;
      local_a8.a = (QString *)&local_68;
      QStringBuilder<QString_&,_QString>::convertTo<QString>(&local_88,&local_a8);
      pcVar2 = local_48.d.ptr;
      data = local_48.d.d;
      qVar4 = local_88.d.size;
      pDVar3 = local_88.d.d;
      local_88.d.d = local_48.d.d;
      local_48.d.d = pDVar3;
      local_48.d.ptr = local_88.d.ptr;
      local_88.d.ptr = pcVar2;
      local_88.d.size = local_48.d.size;
      local_48.d.size = qVar4;
      if (&data->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&data->super_QArrayData,2,0x10);
        }
      }
      if (&(local_a8.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_a8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_a8.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_a8.b.d.d)->super_QArrayData,2,0x10);
        }
      }
      bVar6 = QFile::exists(&local_48);
      if (bVar6) {
        pQVar7 = (QSettings *)operator_new(0x10);
        QSettings::QSettings(pQVar7,&local_48,IniFormat,(QObject *)0x0);
      }
      else {
        local_88.d.ptr = L"/qt.conf";
        local_88.d.d = (Data *)&local_68;
        QStringBuilder<QString_&,_const_char16_t_(&)[9]>::convertTo<QString>
                  ((QString *)&local_a8,
                   (QStringBuilder<QString_&,_const_char16_t_(&)[9]> *)&local_88);
        pcVar5 = local_48.d.ptr;
        pDVar3 = local_48.d.d;
        pcVar2 = local_a8.b.d.ptr;
        pQVar1 = local_a8.a;
        local_a8.a = (QString *)local_48.d.d;
        local_48.d.d = (Data *)pQVar1;
        local_48.d.ptr = (char16_t *)local_a8.b.d.d;
        local_a8.b.d.d = (Data *)pcVar5;
        local_a8.b.d.ptr = (char16_t *)local_48.d.size;
        local_48.d.size = (qsizetype)pcVar2;
        if (&pDVar3->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar3->super_QArrayData,2,0x10);
          }
        }
        bVar6 = QFile::exists(&local_48);
        if (!bVar6) {
          if (local_68 != (QArrayData *)0x0) {
            LOCK();
            local_68->ref_ = (QBasicAtomicInt)(*(int *)&local_68->ref_ + -1);
            UNLOCK();
            if (*(int *)&local_68->ref_ == 0) {
              QArrayData::deallocate(local_68,2,0x10);
            }
          }
          goto LAB_0020d87c;
        }
        pQVar7 = (QSettings *)operator_new(0x10);
        QSettings::QSettings(pQVar7,&local_48,IniFormat,(QObject *)0x0);
      }
      *(QSettings **)
       in_RDI.super___uniq_ptr_impl<QSettings,_std::default_delete<QSettings>_>._M_t.
       super__Tuple_impl<0UL,_QSettings_*,_std::default_delete<QSettings>_>.
       super__Head_base<0UL,_QSettings_*,_false>._M_head_impl = pQVar7;
      if (local_68 != (QArrayData *)0x0) {
        LOCK();
        local_68->ref_ = (QBasicAtomicInt)(*(int *)&local_68->ref_ + -1);
        UNLOCK();
        if (*(int *)&local_68->ref_ == 0) {
          QArrayData::deallocate(local_68,2,0x10);
        }
      }
    }
    else {
LAB_0020d87c:
      *(undefined8 *)
       in_RDI.super___uniq_ptr_impl<QSettings,_std::default_delete<QSettings>_>._M_t.
       super__Tuple_impl<0UL,_QSettings_*,_std::default_delete<QSettings>_>.
       super__Head_base<0UL,_QSettings_*,_false>._M_head_impl = 0;
    }
  }
  pDVar3 = local_48.d.d;
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_0020d5e3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (__uniq_ptr_data<QSettings,_std::default_delete<QSettings>,_true,_true>)
           (tuple<QSettings_*,_std::default_delete<QSettings>_>)
           in_RDI.super___uniq_ptr_impl<QSettings,_std::default_delete<QSettings>_>._M_t.
           super__Tuple_impl<0UL,_QSettings_*,_std::default_delete<QSettings>_>.
           super__Head_base<0UL,_QSettings_*,_false>._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

static std::unique_ptr<QSettings> findConfiguration()
{
    if (qtconfManualPath)
        return std::make_unique<QSettings>(*qtconfManualPath, QSettings::IniFormat);

    QString qtconfig = QStringLiteral(":/qt/etc/qt.conf");
    if (QResource(qtconfig, QLocale::c()).isValid())
        return std::make_unique<QSettings>(qtconfig, QSettings::IniFormat);
#ifdef Q_OS_DARWIN
    CFBundleRef bundleRef = CFBundleGetMainBundle();
    if (bundleRef) {
        QCFType<CFURLRef> urlRef = CFBundleCopyResourceURL(bundleRef,
                                                           QCFString("qt.conf"_L1),
                                                           0,
                                                           0);
        if (urlRef) {
            QCFString path = CFURLCopyFileSystemPath(urlRef, kCFURLPOSIXPathStyle);
            qtconfig = QDir::cleanPath(path);
            if (QFile::exists(qtconfig))
                return std::make_unique<QSettings>(qtconfig, QSettings::IniFormat);
        }
    }
#endif
    if (QCoreApplication::instanceExists()) {
        QString pwd = QCoreApplication::applicationDirPath();
        qtconfig = pwd + u"/qt" QT_STRINGIFY(QT_VERSION_MAJOR) ".conf"_s;
        if (QFile::exists(qtconfig))
            return std::make_unique<QSettings>(qtconfig, QSettings::IniFormat);
        qtconfig = pwd + u"/qt.conf";
        if (QFile::exists(qtconfig))
            return std::make_unique<QSettings>(qtconfig, QSettings::IniFormat);
    }
    return nullptr;     //no luck
}